

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

bool __thiscall ParsedH266TrackData::spsppsExists(ParsedH266TrackData *this,uint8_t *buff,int size)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool local_51;
  NalType nalUnitType;
  uint32_t *cur32;
  uint32_t elSize;
  bool ppsFound;
  bool spsFound;
  bool vpsFound;
  uint8_t *end;
  uint8_t *curPos;
  int size_local;
  uint8_t *buff_local;
  ParsedH266TrackData *this_local;
  
  bVar1 = false;
  bVar2 = false;
  cur32._5_1_ = false;
  for (end = buff;
      end < buff + ((long)size - (long)(int)(uint)(this->super_ParsedH264TrackData).m_nalSize);
      end = end + ((uint32_t)cur32 + (this->super_ParsedH264TrackData).m_nalSize)) {
    if ((this->super_ParsedH264TrackData).m_nalSize == '\x04') {
      cur32._0_4_ = my_ntohl(*(uint32_t *)end);
    }
    else {
      cur32._0_4_ = (uint)*end * 0x10000 + (uint)end[1] * 0x100 + (uint)end[2];
    }
    iVar3 = (int)(uint)end[(int)((this->super_ParsedH264TrackData).m_nalSize + 1)] >> 3;
    if (iVar3 == 0xe) {
      bVar1 = true;
    }
    else if (iVar3 == 0xf) {
      bVar2 = true;
    }
    else if (iVar3 == 0x10) {
      cur32._5_1_ = true;
    }
  }
  local_51 = false;
  if ((bVar1) && (local_51 = false, bVar2)) {
    local_51 = cur32._5_1_;
  }
  return local_51;
}

Assistant:

bool ParsedH266TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool vpsFound = false;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<VvcUnit::NalType>(curPos[m_nalSize + 1] >> 3);
        if (nalUnitType == VvcUnit::NalType::VPS)
            vpsFound = true;
        else if (nalUnitType == VvcUnit::NalType::SPS)
            spsFound = true;
        else if (nalUnitType == VvcUnit::NalType::PPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return vpsFound && spsFound && ppsFound;
}